

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.cpp
# Opt level: O2

wstring * Microsoft::VisualStudio::CppUnitTestFramework::ToString<wchar_t>
                    (wstring *__return_storage_ptr__,CharClass<wchar_t> *cc)

{
  long lVar1;
  pointer pRVar2;
  wostream *pwVar3;
  Range<wchar_t> *r;
  pointer pRVar4;
  wostringstream os;
  uint auStack_190 [88];
  
  std::__cxx11::wostringstream::wostringstream((wostringstream *)&os);
  *(uint *)((long)auStack_190 + *(long *)(_os + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(_os + -0x18)) & 0xffffffb5 | 8;
  pwVar3 = std::operator<<(&os,0x30);
  lVar1 = *(long *)pwVar3;
  *(undefined8 *)(pwVar3 + *(long *)(lVar1 + -0x18) + 0x10) = 8;
  *(uint *)(pwVar3 + *(long *)(lVar1 + -0x18) + 0x18) =
       *(uint *)(pwVar3 + *(long *)(lVar1 + -0x18) + 0x18) | 0x200;
  std::wostream::put((wchar_t)&os);
  pRVar2 = (cc->m_ranges).
           super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pRVar4 = (cc->m_ranges).
                super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pRVar4 != pRVar2; pRVar4 = pRVar4 + 1) {
    pwVar3 = (wostream *)&os;
    if (pRVar4->m_start + L'\x01' != pRVar4->m_end) {
      pwVar3 = std::wostream::_M_insert<unsigned_long>((ulong)&os);
      pwVar3 = std::operator<<(pwVar3,L'-');
    }
    std::wostream::_M_insert<unsigned_long>((ulong)pwVar3);
    std::operator<<((wostream *)&os,L' ');
  }
  std::wostream::put((wchar_t)&os);
  std::__cxx11::wstringbuf::str();
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)&os);
  return __return_storage_ptr__;
}

Assistant:

std::wstring ToString(const Centaurus::CharClass<TCHAR>& cc)
            {
                std::wostringstream os;
                
                os << std::hex << std::setfill(L'0') << std::setw(sizeof(TCHAR) * 2) << std::showbase;
                os.put(L'[');
                for (const auto& r : cc)
                {
                    if (r.start() + 1 == r.end())
                        os << (unsigned int)r.start();
                    else
                        os << (unsigned int)r.start() << L'-' << (unsigned int)r.end() - 1;
                    os << L' ';
                }
                os.put(L']');

                return os.str();
            }